

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryResult.h
# Opt level: O0

QueryResult * QueryResult::empty(void)

{
  QueryResult *in_RDI;
  SortedRun *in_stack_ffffffffffffff98;
  
  SortedRun::SortedRun(&in_RDI->results);
  QueryResult(in_RDI,in_stack_ffffffffffffff98);
  SortedRun::~SortedRun(&in_RDI->results);
  return in_RDI;
}

Assistant:

static QueryResult empty() { return QueryResult(SortedRun()); }